

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedNumberFormat::stripWhitespace
          (RuleBasedNumberFormat *this,UnicodeString *description)

{
  short sVar1;
  ushort uVar2;
  UBool UVar3;
  uint uVar4;
  int32_t iVar5;
  char16_t *pcVar6;
  int iVar7;
  uint srcStart;
  uint uVar8;
  long lVar9;
  uint uVar10;
  UnicodeString result;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  uVar10 = 0;
  do {
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    uVar8 = (uint)sVar1;
    if (sVar1 < 0) {
      uVar4 = (description->fUnion).fFields.fLength;
    }
    else {
      uVar4 = (int)uVar8 >> 5;
    }
    if ((int)uVar4 <= (int)uVar10) goto LAB_0021dda1;
    lVar9 = (long)(int)uVar10;
    srcStart = uVar10;
    do {
      uVar10 = 0xffff;
      if (srcStart < uVar4) {
        pcVar6 = (char16_t *)((long)&description->fUnion + 2);
        if ((uVar8 & 2) == 0) {
          pcVar6 = (description->fUnion).fFields.fArray;
        }
        uVar10 = (uint)(ushort)pcVar6[lVar9];
      }
      UVar3 = PatternProps::isWhiteSpace(uVar10);
      uVar2 = (description->fUnion).fStackFields.fLengthAndFlags;
      uVar8 = (uint)uVar2;
      uVar10 = (int)(short)uVar2 >> 5;
      if (UVar3 == '\0') break;
      uVar4 = uVar10;
      if ((short)uVar2 < 0) {
        uVar4 = (description->fUnion).fFields.fLength;
      }
      lVar9 = lVar9 + 1;
      srcStart = srcStart + 1;
    } while (lVar9 < (int)uVar4);
    if ((int)srcStart < 0) {
      uVar8 = (description->fUnion).fFields.fLength;
      uVar4 = 0;
    }
    else {
      uVar8 = (description->fUnion).fFields.fLength;
      uVar4 = uVar10;
      if ((short)uVar2 < 0) {
        uVar4 = uVar8;
      }
      if ((int)srcStart <= (int)uVar4) {
        uVar4 = srcStart;
      }
    }
    if ((short)uVar2 < 0) {
      uVar10 = uVar8;
    }
    iVar5 = UnicodeString::doIndexOf(description,L';',uVar4,uVar10 - uVar4);
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (description->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    if (iVar5 == -1) {
      UnicodeString::doAppend(&local_70,description,srcStart,iVar7 - srcStart);
      goto LAB_0021dda1;
    }
    if (iVar7 <= iVar5) goto LAB_0021dda1;
    uVar10 = iVar5 + 1;
    UnicodeString::doAppend(&local_70,description,srcStart,uVar10 - srcStart);
    if (uVar10 == 0xffffffff) {
LAB_0021dda1:
      UnicodeString::copyFrom(description,&local_70,'\0');
      UnicodeString::~UnicodeString(&local_70);
      return;
    }
  } while( true );
}

Assistant:

void
RuleBasedNumberFormat::stripWhitespace(UnicodeString& description)
{
    // iterate through the characters...
    UnicodeString result;

    int start = 0;
    while (start != -1 && start < description.length()) {
        // seek to the first non-whitespace character...
        while (start < description.length()
            && PatternProps::isWhiteSpace(description.charAt(start))) {
            ++start;
        }

        // locate the next semicolon in the text and copy the text from
        // our current position up to that semicolon into the result
        int32_t p = description.indexOf(gSemiColon, start);
        if (p == -1) {
            // or if we don't find a semicolon, just copy the rest of
            // the string into the result
            result.append(description, start, description.length() - start);
            start = -1;
        }
        else if (p < description.length()) {
            result.append(description, start, p + 1 - start);
            start = p + 1;
        }

        // when we get here, we've seeked off the end of the string, and
        // we terminate the loop (we continue until *start* is -1 rather
        // than until *p* is -1, because otherwise we'd miss the last
        // rule in the description)
        else {
            start = -1;
        }
    }

    description.setTo(result);
}